

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int attrset_remove_attr(BigAttrSet *attrset,char *attrname)

{
  int iVar1;
  void *__dest;
  BigAttr lookup;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = attrname;
  __dest = bsearch(&local_38,attrset->attrlist,attrset->listused,0x20,attr_cmp);
  if (__dest == (void *)0x0) {
    _big_file_raise("Attribute name \'%s\' is not found.",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x6a5,attrname);
    iVar1 = -1;
  }
  else {
    memmove(__dest,(void *)((long)__dest + 0x20),
            (((ulong)~((long)__dest - (long)attrset->attrlist) >> 5) + attrset->listused) * 0x20);
    attrset->listused = attrset->listused - 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
attrset_remove_attr(BigAttrSet * attrset, const char * attrname)
{
    BigAttr *attr = attrset_lookup_attr(attrset, attrname);
    RAISEIF(attr == NULL,
      ex_notfound,
      "Attribute name '%s' is not found.", attrname
    )
    ptrdiff_t ind = attr - attrset->attrlist;
    memmove(&attrset->attrlist[ind], &attrset->attrlist[ind + 1],
        (attrset->listused - ind - 1) * sizeof(BigAttr));
    attrset->listused -= 1;

    return 0;

ex_notfound:
    return -1;
}